

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::EquidistantDistortion::transform
          (EquidistantDistortion *this,double *x,double *y,double xd,double yd)

{
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  double td;
  double theta8;
  double theta6;
  double theta4;
  double theta2;
  double theta;
  double radius;
  undefined8 local_28;
  undefined8 local_20;
  
  __x = sqrt(in_XMM0_Qa * in_XMM0_Qa + in_XMM1_Qa * in_XMM1_Qa);
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  if (1e-09 < __x) {
    dVar1 = atan(__x);
    dVar2 = dVar1 * dVar1;
    dVar3 = dVar2 * dVar2;
    dVar1 = dVar1 * (*(double *)(in_RDI + 0x20) * dVar3 * dVar3 +
                    *(double *)(in_RDI + 0x18) * dVar3 * dVar2 +
                    *(double *)(in_RDI + 0x10) * dVar3 + *(double *)(in_RDI + 8) * dVar2 + 1.0);
    local_20 = (dVar1 / __x) * in_XMM0_Qa;
    local_28 = (dVar1 / __x) * in_XMM1_Qa;
  }
  *in_RSI = local_20;
  *in_RDX = local_28;
  return;
}

Assistant:

void EquidistantDistortion::transform(double &x, double &y, double xd, double yd) const
{
  const double radius=std::sqrt(xd*xd+yd*yd);

  if (radius > 1e-9)
  {
    const double theta=std::atan(radius);
    const double theta2=theta*theta;
    const double theta4=theta2*theta2;
    const double theta6=theta4*theta2;
    const double theta8=theta4*theta4;
    const double td=theta*(1+ed[0]*theta2+ed[1]*theta4+ed[2]*theta6+ed[3]*theta8);

    xd*=td/radius;
    yd*=td/radius;
  }

  x=xd;
  y=yd;
}